

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlfield.cpp
# Opt level: O0

void __thiscall QSqlField::setTableName(QSqlField *this,QString *tableName)

{
  QSqlFieldPrivate *pQVar1;
  QString *in_RSI;
  
  detach((QSqlField *)0x133b81);
  pQVar1 = QExplicitlySharedDataPointer<QSqlFieldPrivate>::operator->
                     ((QExplicitlySharedDataPointer<QSqlFieldPrivate> *)0x133b99);
  QString::operator=(&pQVar1->table,in_RSI);
  return;
}

Assistant:

void QSqlField::setTableName(const QString &tableName)
{
    detach();
    d->table = tableName;
}